

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PipelineStateBase.hpp
# Opt level: O3

void __thiscall
Diligent::PipelineStateBase<Diligent::EngineVkImplTraits>::ReserveSpaceForPipelineDesc
          (PipelineStateBase<Diligent::EngineVkImplTraits> *this,
          GraphicsPipelineStateCreateInfo *CreateInfo,FixedLinearAllocator *MemPool)

{
  LayoutElement *pLVar1;
  uint uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  long lVar6;
  
  FixedLinearAllocator::AddSpace(MemPool,0xe0,8);
  ReserveResourceLayout(&(CreateInfo->super_PipelineStateCreateInfo).PSODesc.ResourceLayout,MemPool)
  ;
  ReserveResourceSignatures(this,&CreateInfo->super_PipelineStateCreateInfo,MemPool);
  uVar4 = (ulong)(CreateInfo->GraphicsPipeline).InputLayout.NumElements;
  if (uVar4 != 0) {
    FixedLinearAllocator::AddSpace(MemPool,uVar4 * 0x28,8);
    uVar4 = 0;
    if ((CreateInfo->GraphicsPipeline).InputLayout.NumElements != 0) {
      lVar6 = 0;
      uVar5 = 0;
      do {
        pLVar1 = (CreateInfo->GraphicsPipeline).InputLayout.LayoutElements;
        FixedLinearAllocator::AddSpaceForString
                  (MemPool,*(Char **)((long)&pLVar1->HLSLSemantic + lVar6),0);
        uVar2 = *(int *)((long)&pLVar1->BufferSlot + lVar6) + 1;
        uVar3 = (ulong)uVar2;
        if (uVar2 < (uint)uVar4) {
          uVar3 = uVar4;
        }
        uVar5 = uVar5 + 1;
        lVar6 = lVar6 + 0x28;
        uVar4 = uVar3;
      } while (uVar5 < (CreateInfo->GraphicsPipeline).InputLayout.NumElements);
      uVar4 = uVar3 << 2;
    }
    FixedLinearAllocator::AddSpace(MemPool,uVar4,4);
    return;
  }
  return;
}

Assistant:

void ReserveSpaceForPipelineDesc(const GraphicsPipelineStateCreateInfo& CreateInfo,
                                     FixedLinearAllocator&                  MemPool) noexcept
    {
        MemPool.AddSpace<GraphicsPipelineData>();
        ReserveResourceLayout(CreateInfo.PSODesc.ResourceLayout, MemPool);
        ReserveResourceSignatures(CreateInfo, MemPool);

        const InputLayoutDesc& InputLayout = CreateInfo.GraphicsPipeline.InputLayout;
        if (InputLayout.NumElements > 0)
        {
            Uint32 BufferSlotsUsed = 0;
            MemPool.AddSpace<LayoutElement>(InputLayout.NumElements);
            for (Uint32 i = 0; i < InputLayout.NumElements; ++i)
            {
                const LayoutElement& LayoutElem = InputLayout.LayoutElements[i];
                MemPool.AddSpaceForString(LayoutElem.HLSLSemantic);
                BufferSlotsUsed = std::max(BufferSlotsUsed, LayoutElem.BufferSlot + 1);
            }

            MemPool.AddSpace<Uint32>(BufferSlotsUsed);
        }

        static_assert(std::is_trivially_destructible<decltype(*InputLayout.LayoutElements)>::value, "Add destructor for this object to Destruct()");
    }